

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void Parser::eliCommonPreffix(void)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference b;
  reference pvVar7;
  __normal_iterator<Parser::Rule_*,_std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>_>
  local_158;
  __normal_iterator<Parser::Rule_*,_std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>_>
  local_150;
  const_iterator local_148;
  Rule local_140;
  int local_124;
  iterator iStack_120;
  int t;
  __normal_iterator<Parser::Rule_*,_std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>_>
  local_118;
  __normal_iterator<Parser::Rule_*,_std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>_>
  local_110;
  const_iterator local_108;
  Rule local_100;
  Rule local_e8;
  Rule local_d0;
  Rule local_b8;
  __cxx11 local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  int local_60;
  int nId;
  Rule local_50;
  int local_38;
  int local_34;
  int k;
  int j;
  undefined1 local_28 [3];
  bool flag;
  int i;
  Rule LCP;
  int cnt;
  
  LCP.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  Rule::Rule((Rule *)local_28);
  j = 0;
  do {
    uVar3 = (ulong)j;
    sVar4 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::size
                      ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids);
    if (sVar4 <= uVar3) {
      Rule::~Rule((Rule *)local_28);
      return;
    }
    k._3_1_ = 1;
LAB_0010b630:
    if ((k._3_1_ & 1) != 0) {
      k._3_1_ = 0;
      local_34 = 0;
      while( true ) {
        uVar3 = (ulong)local_34;
        pvVar5 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                           ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,(long)j);
        sVar4 = std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::size(&pvVar5->rules);
        iVar2 = local_34;
        if (sVar4 <= uVar3) break;
        do {
          local_38 = iVar2 + 1;
          uVar3 = (ulong)local_38;
          pvVar5 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                             ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,(long)j);
          sVar4 = std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::size(&pvVar5->rules);
          if (sVar4 <= uVar3) break;
          pvVar5 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                             ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,(long)j);
          pvVar6 = std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::operator[]
                             (&pvVar5->rules,(long)local_34);
          pvVar5 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                             ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,(long)j);
          b = std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::operator[]
                        (&pvVar5->rules,(long)local_38);
          getLCP(&local_50,pvVar6,b);
          Rule::operator=((Rule *)local_28,&local_50);
          Rule::~Rule(&local_50);
          bVar1 = Rule::isNone((Rule *)local_28);
          if (!bVar1) {
            k._3_1_ = 1;
            pvVar5 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                               ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,(long)j);
            LCP.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ =
                 LCP.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
            std::__cxx11::to_string
                      (local_a0,LCP.rights.
                                super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            std::operator+(local_80,&pvVar5->sgn);
            iVar2 = addMid(local_80);
            std::__cxx11::string::~string((string *)local_80);
            std::__cxx11::string::~string((string *)local_a0);
            local_60 = iVar2;
            pvVar5 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                               ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,
                                (long)iVar2);
            pvVar7 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                               ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,(long)j);
            pvVar6 = std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::operator[]
                               (&pvVar7->rules,(long)local_34);
            sVar4 = std::vector<Parser::Node,_std::allocator<Parser::Node>_>::size
                              ((vector<Parser::Node,_std::allocator<Parser::Node>_> *)local_28);
            Rule::getSuffix(&local_b8,pvVar6,(int)sVar4);
            std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::push_back
                      (&pvVar5->rules,&local_b8);
            Rule::~Rule(&local_b8);
            pvVar5 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                               ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,
                                (long)local_60);
            pvVar7 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                               ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,(long)j);
            pvVar6 = std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::operator[]
                               (&pvVar7->rules,(long)local_38);
            sVar4 = std::vector<Parser::Node,_std::allocator<Parser::Node>_>::size
                              ((vector<Parser::Node,_std::allocator<Parser::Node>_> *)local_28);
            Rule::getSuffix(&local_d0,pvVar6,(int)sVar4);
            std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::push_back
                      (&pvVar5->rules,&local_d0);
            Rule::~Rule(&local_d0);
            getRule(&local_100,local_60);
            Rule::operator+(&local_e8,(Rule *)local_28,&local_100);
            pvVar5 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                               ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,(long)j);
            pvVar6 = std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::operator[]
                               (&pvVar5->rules,(long)local_34);
            Rule::operator=(pvVar6,&local_e8);
            Rule::~Rule(&local_e8);
            Rule::~Rule(&local_100);
            pvVar5 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                               ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,(long)j);
            pvVar7 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                               ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,(long)j);
            local_118._M_current =
                 (Rule *)std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::begin
                                   (&pvVar7->rules);
            local_110 = __gnu_cxx::
                        __normal_iterator<Parser::Rule_*,_std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>_>
                        ::operator+(&local_118,(long)local_38);
            __gnu_cxx::
            __normal_iterator<Parser::Rule_const*,std::vector<Parser::Rule,std::allocator<Parser::Rule>>>
            ::__normal_iterator<Parser::Rule*>
                      ((__normal_iterator<Parser::Rule_const*,std::vector<Parser::Rule,std::allocator<Parser::Rule>>>
                        *)&local_108,&local_110);
            iStack_120 = std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::erase
                                   (&pvVar5->rules,local_108);
            local_124 = 0;
            while( true ) {
              uVar3 = (ulong)local_124;
              pvVar5 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                                 ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,(long)j)
              ;
              sVar4 = std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::size(&pvVar5->rules)
              ;
              if (sVar4 <= uVar3) break;
              if ((local_124 != local_34) && (local_124 != local_38)) {
                pvVar5 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                                   ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,
                                    (long)j);
                pvVar6 = std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::operator[]
                                   (&pvVar5->rules,(long)local_124);
                bVar1 = Rule::contain(pvVar6,(Rule *)local_28);
                if (bVar1) {
                  pvVar5 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                                     ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,
                                      (long)local_60);
                  pvVar7 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                                     ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,
                                      (long)j);
                  pvVar6 = std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::operator[]
                                     (&pvVar7->rules,(long)local_124);
                  sVar4 = std::vector<Parser::Node,_std::allocator<Parser::Node>_>::size
                                    ((vector<Parser::Node,_std::allocator<Parser::Node>_> *)local_28
                                    );
                  Rule::getSuffix(&local_140,pvVar6,(int)sVar4);
                  std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::push_back
                            (&pvVar5->rules,&local_140);
                  Rule::~Rule(&local_140);
                  pvVar5 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                                     ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,
                                      (long)j);
                  pvVar7 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                                     ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,
                                      (long)j);
                  local_158._M_current =
                       (Rule *)std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::begin
                                         (&pvVar7->rules);
                  local_150 = __gnu_cxx::
                              __normal_iterator<Parser::Rule_*,_std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>_>
                              ::operator+(&local_158,(long)local_124);
                  __gnu_cxx::
                  __normal_iterator<Parser::Rule_const*,std::vector<Parser::Rule,std::allocator<Parser::Rule>>>
                  ::__normal_iterator<Parser::Rule*>
                            ((__normal_iterator<Parser::Rule_const*,std::vector<Parser::Rule,std::allocator<Parser::Rule>>>
                              *)&local_148,&local_150);
                  std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::erase
                            (&pvVar5->rules,local_148);
                }
              }
              local_124 = local_124 + 1;
            }
          }
          iVar2 = local_38;
        } while ((k._3_1_ & 1) == 0);
        if ((k._3_1_ & 1) != 0) break;
        local_34 = local_34 + 1;
      }
      goto LAB_0010b630;
    }
    j = j + 1;
  } while( true );
}

Assistant:

void eliCommonPreffix(){
        int cnt=0;
        Rule LCP;
        for(int i = 0;i < mids.size();i++){
            bool flag = true;
            while(flag){
                flag = false;
                for(int j = 0;j < mids[i].rules.size();j++){
                    for(int k = j+1;k < mids[i].rules.size();k++){
                        LCP = getLCP(mids[i].rules[j],mids[i].rules[k]);
                        if(!LCP.isNone()){
                            flag=true;
                            int nId = addMid(mids[i].sgn+to_string(++cnt));
                            mids[nId].rules.push_back(mids[i].rules[j].getSuffix((int)LCP.rights.size()));
                            mids[nId].rules.push_back(mids[i].rules[k].getSuffix((int)LCP.rights.size()));
                            mids[i].rules[j] = LCP + getRule(nId);
                            mids[i].rules.erase(mids[i].rules.begin()+k);
                            for(int t = 0;t < mids[i].rules.size();t++){
                                if(t==j||t==k) continue;
                                if(mids[i].rules[t].contain(LCP)){
                                    mids[nId].rules.push_back(mids[i].rules[t].getSuffix((int)LCP.rights.size()));
                                    mids[i].rules.erase(mids[i].rules.begin()+t);
                                }
                            }
                        }
                        if(flag) break;
                    }
                    if(flag)break;
                }
            }
        }
    }